

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O2

h264_macroblock * h264_mb_nb_p(h264_slice *slice,h264_mb_pos pos,int inter)

{
  int iVar1;
  h264_macroblock *phVar2;
  uint uVar3;
  uint mbaddr;
  bool bVar4;
  
  bVar4 = slice->mbaff_frame_flag != 0;
  mbaddr = slice->curr_mb_addr;
  uVar3 = mbaddr >> bVar4;
  switch(pos) {
  case H264_MB_THIS:
    goto switchD_001037f2_caseD_0;
  case H264_MB_A:
    if (uVar3 % slice->pic_width_in_mbs != 0) {
      uVar3 = uVar3 - 1;
      break;
    }
    goto LAB_00103865;
  case H264_MB_B:
    uVar3 = uVar3 - slice->pic_width_in_mbs;
    break;
  case H264_MB_C:
    if ((uVar3 + 1) % slice->pic_width_in_mbs == 0) goto LAB_00103865;
    uVar3 = (uVar3 + 1) - slice->pic_width_in_mbs;
    break;
  case H264_MB_D:
    if (uVar3 % slice->pic_width_in_mbs == 0) goto LAB_00103865;
    uVar3 = uVar3 + ~slice->pic_width_in_mbs;
  }
  mbaddr = uVar3 << bVar4;
  iVar1 = h264_mb_avail(slice,mbaddr);
  if (iVar1 == 0) {
LAB_00103865:
    phVar2 = &mb_unavail_inter;
    if (inter == 0) {
      phVar2 = &mb_unavail_intra;
    }
  }
  else {
switchD_001037f2_caseD_0:
    phVar2 = slice->mbs + mbaddr;
  }
  return phVar2;
}

Assistant:

const struct h264_macroblock *h264_mb_nb_p(struct h264_slice *slice, enum h264_mb_pos pos, int inter) {
	uint32_t mbaddr = slice->curr_mb_addr;
	if (slice->mbaff_frame_flag)
		mbaddr /= 2;
	switch (pos) {
		case H264_MB_THIS:
			return &slice->mbs[slice->curr_mb_addr];
		case H264_MB_A:
			if ((mbaddr % slice->pic_width_in_mbs) == 0)
				return h264_mb_unavail(inter);
			mbaddr--;
			break;
		case H264_MB_B:
			mbaddr -= slice->pic_width_in_mbs;
			break;
		case H264_MB_C:
			if (((mbaddr+1) % slice->pic_width_in_mbs) == 0)
				return h264_mb_unavail(inter);
			mbaddr -= slice->pic_width_in_mbs - 1;
			break;
		case H264_MB_D:
			if ((mbaddr % slice->pic_width_in_mbs) == 0)
				return h264_mb_unavail(inter);
			mbaddr -= slice->pic_width_in_mbs + 1;
			break;
	}
	if (slice->mbaff_frame_flag)
		mbaddr *= 2;
	if (!h264_mb_avail(slice, mbaddr))
		return h264_mb_unavail(inter);
	return &slice->mbs[mbaddr];
}